

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O0

bool P_CheckSwitchRange(AActor *user,line_t *line,int sideno,DVector3 *optpos)

{
  F3DFloor *pFVar1;
  sector_t *psVar2;
  line_t *plVar3;
  bool bVar4;
  FTextureID FVar5;
  uint uVar6;
  FSwitchDef *pFVar7;
  xfloor *this;
  F3DFloor **ppFVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool local_1eb;
  bool local_1ea;
  bool local_1bd;
  F3DFloor *rover_1;
  uint i;
  sector_t *back_1;
  F3DFloor *rover;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range2;
  sector_t *back;
  double sectorf;
  double sectorc;
  DVector3 pos;
  DVector2 check;
  double inter;
  divline_t dlu;
  divline_t dll;
  undefined1 auStack_e0 [4];
  int flags;
  FLineOpening open;
  sector_t *front;
  double checkbot;
  double checktop;
  side_t *side;
  DVector3 *optpos_local;
  line_t *plStack_20;
  int sideno_local;
  line_t *line_local;
  AActor *user_local;
  
  checktop = (double)line->sidedef[sideno];
  if ((side_t *)checktop == (side_t *)0x0) {
    user_local._7_1_ = true;
  }
  else {
    open._136_8_ = ((side_t *)checktop)->sector;
    side = (side_t *)optpos;
    optpos_local._4_4_ = sideno;
    plStack_20 = line;
    line_local = (line_t *)user;
    FLineOpening::FLineOpening((FLineOpening *)auStack_e0);
    dll.dy._4_4_ = plStack_20->flags;
    dll.dy._0_4_ = side_t::GetTexture((side_t *)checktop,1);
    bVar4 = FTextureID::isValid((FTextureID *)&dll.dy);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      dll.dy._4_4_ = dll.dy._4_4_ & 0xffdfffff;
    }
    if ((dll.dy._4_4_ & 0x600000) == 0) {
      user_local._7_1_ = true;
    }
    else {
      TVector2<double>::TVector2((TVector2<double> *)&pos.Z);
      P_MakeDivline(plStack_20,(divline_t *)&dlu.dy);
      if (side == (side_t *)0x0) {
        AActor::PosRelative((DVector3 *)&sectorc,(AActor *)line_local,plStack_20);
      }
      else {
        TVector3<double>::TVector3((TVector3<double> *)&sectorc,(TVector3<double> *)side);
      }
      inter = sectorc;
      dlu.x = pos.X;
      dlu.y = TAngle<double>::Cos((TAngle<double> *)&line_local->portalindex);
      dlu.dx = TAngle<double>::Sin((TAngle<double> *)&line_local->portalindex);
      dVar9 = P_InterceptVector((divline_t *)&dlu.dy,(divline_t *)&inter);
      if ((plStack_20->sidedef[0]->Flags & 0x40) == 0) {
        pos.Z = dlu.dy + dll.y * dVar9;
      }
      else {
        pos.Z = dlu.dy + dll.y * (dVar9 + 0.01);
        open._136_8_ = P_PointInSector((DVector2 *)&pos.Z);
      }
      if (((plStack_20->sidedef[1] == (side_t *)0x0) ||
          ((plStack_20->sidedef[0]->Flags & 0x40) != 0)) ||
         (P_LineOpening((FLineOpening *)auStack_e0,(AActor *)0x0,plStack_20,(DVector2 *)&pos.Z,
                        (DVector3 *)&sectorc,0), open.bottom <= 0.0)) {
        dVar9 = secplane_t::ZatPoint((secplane_t *)(open._136_8_ + 0xd8),(DVector2 *)&pos.Z);
        dVar10 = secplane_t::ZatPoint((secplane_t *)(open._136_8_ + 0xb0),(DVector2 *)&pos.Z);
        dVar11 = AActor::Top((AActor *)line_local);
        local_1bd = false;
        if (dVar10 <= dVar11) {
          dVar10 = AActor::Z((AActor *)line_local);
          local_1bd = dVar10 <= dVar9;
        }
        user_local._7_1_ = local_1bd;
      }
      else {
        FVar5 = side_t::GetTexture((side_t *)checktop,0);
        pFVar7 = FTextureManager::FindSwitch(&TexMan,FVar5);
        if (pFVar7 == (FSwitchDef *)0x0) {
          FVar5 = side_t::GetTexture((side_t *)checktop,2);
          pFVar7 = FTextureManager::FindSwitch(&TexMan,FVar5);
          if (pFVar7 == (FSwitchDef *)0x0) {
            bVar4 = true;
            if ((dll.dy._4_4_ & 0x200000) == 0) {
              FVar5 = side_t::GetTexture((side_t *)checktop,1);
              pFVar7 = FTextureManager::FindSwitch(&TexMan,FVar5);
              bVar4 = pFVar7 != (FSwitchDef *)0x0;
            }
            if (bVar4) {
              bVar4 = P_GetMidTexturePosition
                                (plStack_20,optpos_local._4_4_,&checkbot,(double *)&front);
              if (bVar4) {
                bVar4 = AActor::isBelow((AActor *)line_local,checkbot);
                local_1ea = false;
                if (bVar4) {
                  dVar9 = AActor::Top((AActor *)line_local);
                  local_1ea = (double)front < dVar9;
                }
                user_local._7_1_ = local_1ea;
              }
              else {
                user_local._7_1_ = false;
              }
            }
            else {
              dVar9 = AActor::Top((AActor *)line_local);
              local_1eb = true;
              if (dVar9 <= _auStack_e0) {
                local_1eb = AActor::isBelow((AActor *)line_local,open.top);
              }
              user_local._7_1_ = local_1eb;
            }
          }
          else {
            psVar2 = plStack_20->sidedef[1 - optpos_local._4_4_]->sector;
            for (rover_1._4_4_ = 0;
                uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                                  ((TArray<F3DFloor_*,_F3DFloor_*> *)&psVar2->e->XFloor),
                rover_1._4_4_ < uVar6; rover_1._4_4_ = rover_1._4_4_ + 1) {
              ppFVar8 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                                  ((TArray<F3DFloor_*,_F3DFloor_*> *)&psVar2->e->XFloor,
                                   (ulong)rover_1._4_4_);
              plVar3 = line_local;
              pFVar1 = *ppFVar8;
              if (((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 0x40000) != 0)) {
                dVar9 = secplane_t::ZatPoint((pFVar1->top).plane,(DVector2 *)&pos.Z);
                bVar4 = AActor::isAbove((AActor *)plVar3,dVar9);
                if (!bVar4) {
                  dVar9 = AActor::Top((AActor *)line_local);
                  dVar10 = secplane_t::ZatPoint((pFVar1->bottom).plane,(DVector2 *)&pos.Z);
                  if (dVar10 <= dVar9) {
                    return true;
                  }
                }
              }
            }
            dVar9 = AActor::Z((AActor *)line_local);
            user_local._7_1_ = dVar9 < open.top;
          }
        }
        else {
          this = &plStack_20->sidedef[1 - optpos_local._4_4_]->sector->e->XFloor;
          __end2 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this);
          rover = (F3DFloor *)
                  TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this);
          while (bVar4 = TIterator<F3DFloor_*>::operator!=(&__end2,(TIterator<F3DFloor_*> *)&rover),
                bVar4) {
            ppFVar8 = TIterator<F3DFloor_*>::operator*(&__end2);
            plVar3 = line_local;
            pFVar1 = *ppFVar8;
            if (((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 0x20000) != 0)) {
              dVar9 = secplane_t::ZatPoint((pFVar1->top).plane,(DVector2 *)&pos.Z);
              bVar4 = AActor::isAbove((AActor *)plVar3,dVar9);
              if (!bVar4) {
                dVar9 = AActor::Top((AActor *)line_local);
                dVar10 = secplane_t::ZatPoint((pFVar1->bottom).plane,(DVector2 *)&pos.Z);
                if (dVar10 <= dVar9) {
                  return true;
                }
              }
            }
            TIterator<F3DFloor_*>::operator++(&__end2);
          }
          dVar9 = AActor::Top((AActor *)line_local);
          user_local._7_1_ = _auStack_e0 < dVar9;
        }
      }
    }
  }
  return user_local._7_1_;
}

Assistant:

bool P_CheckSwitchRange(AActor *user, line_t *line, int sideno, const DVector3 *optpos)
{
	// Activated from an empty side -> always succeed
	side_t *side = line->sidedef[sideno];
	if (side == NULL)
		return true;

	double checktop;
	double checkbot;
	sector_t *front = side->sector;
	FLineOpening open;
	int flags = line->flags;

	if (!side->GetTexture(side_t::mid).isValid())
	{ // Do not force range checks for 3DMIDTEX lines if there is no actual midtexture.
		flags &= ~ML_3DMIDTEX;
	}

	// 3DMIDTEX forces CHECKSWITCHRANGE because otherwise it might cause problems.
	if (!(flags & (ML_3DMIDTEX|ML_CHECKSWITCHRANGE)))
		return true;

	// calculate the point where the user would touch the wall.
	divline_t dll, dlu;
	double inter;
	DVector2 check;

	P_MakeDivline (line, &dll);

	DVector3 pos = optpos? *optpos : user->PosRelative(line);
	dlu.x = pos.X;
	dlu.y = pos.Y;
	dlu.dx = user->Angles.Yaw.Cos();
	dlu.dy = user->Angles.Yaw.Sin();
	inter = P_InterceptVector(&dll, &dlu);


	// Polyobjects must test the containing sector, not the one they originate from.
	if (line->sidedef[0]->Flags & WALLF_POLYOBJ)
	{
		// Get a check point slightly inside the polyobject so that this still works
		// if the polyobject lies directly on a sector boundary
		check.X = dll.x + dll.dx * (inter + 0.01);
		check.Y = dll.y + dll.dy * (inter + 0.01);
		front = P_PointInSector(check);
	}
	else
	{
		check.X = dll.x + dll.dx * inter;
		check.Y = dll.y + dll.dy * inter;
	}


	// one sided line or polyobject
	if (line->sidedef[1] == NULL || (line->sidedef[0]->Flags & WALLF_POLYOBJ))
	{
	onesided:
		double sectorc = front->ceilingplane.ZatPoint(check);
		double sectorf = front->floorplane.ZatPoint(check);
		return (user->Top() >= sectorf && user->Z() <= sectorc);
	}

	// Now get the information from the line.
	P_LineOpening(open, NULL, line, check, &pos);
	if (open.range <= 0)
		goto onesided;

	if ((TexMan.FindSwitch(side->GetTexture(side_t::top))) != NULL)
	{

		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (auto rover : back->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_UPPERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Top() > open.top);
	}
	else if ((TexMan.FindSwitch(side->GetTexture(side_t::bottom))) != NULL)
	{
		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (unsigned i = 0; i < back->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = back->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_LOWERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Z() < open.bottom);
	}
	else if ((flags & ML_3DMIDTEX) || (TexMan.FindSwitch(side->GetTexture(side_t::mid))) != NULL)
	{
		// 3DMIDTEX lines will force a mid texture check if no switch is found on this line
		// to keep compatibility with Eternity's implementation.
		if (!P_GetMidTexturePosition(line, sideno, &checktop, &checkbot))
			return false;
		return user->isBelow(checktop) && user->Top() > checkbot;
	}
	else
	{
		// no switch found. Check whether the player can touch either top or bottom texture
		return (user->Top() > open.top) || (user->isBelow(open.bottom));
	}
}